

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O2

Result __thiscall
wabt::WastParser::ParseMemoryExpr<wabt::MemoryExpr<(wabt::ExprType)30>>
          (WastParser *this,Location loc,
          unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> *out_expr)

{
  Expr *pEVar1;
  Location loc_00;
  Result RVar2;
  MemoryExpr<(wabt::ExprType)30> *this_00;
  Enum EVar3;
  Var memidx;
  Var local_68;
  
  Var::Var(&memidx);
  loc_00.filename._M_str = loc.filename._M_str;
  loc_00.filename._M_len = loc.filename._M_len;
  loc_00.field_1.field_1.offset = loc.field_1.field_1.offset;
  loc_00.field_1._8_8_ = loc.field_1._8_8_;
  RVar2 = ParseMemidx(this,loc_00,&memidx);
  if (RVar2.enum_ == Error) {
    EVar3 = Error;
  }
  else {
    this_00 = (MemoryExpr<(wabt::ExprType)30> *)operator_new(0x88);
    Var::Var(&local_68,&memidx);
    MemoryExpr<(wabt::ExprType)30>::MemoryExpr(this_00,&local_68,&loc);
    pEVar1 = (out_expr->_M_t).super___uniq_ptr_impl<wabt::Expr,_std::default_delete<wabt::Expr>_>.
             _M_t.super__Tuple_impl<0UL,_wabt::Expr_*,_std::default_delete<wabt::Expr>_>.
             super__Head_base<0UL,_wabt::Expr_*,_false>._M_head_impl;
    (out_expr->_M_t).super___uniq_ptr_impl<wabt::Expr,_std::default_delete<wabt::Expr>_>._M_t.
    super__Tuple_impl<0UL,_wabt::Expr_*,_std::default_delete<wabt::Expr>_>.
    super__Head_base<0UL,_wabt::Expr_*,_false>._M_head_impl = (Expr *)this_00;
    if (pEVar1 != (Expr *)0x0) {
      (*pEVar1->_vptr_Expr[1])();
    }
    Var::~Var(&local_68);
    EVar3 = Ok;
  }
  Var::~Var(&memidx);
  return (Result)EVar3;
}

Assistant:

Result WastParser::ParseMemoryExpr(Location loc,
                                   std::unique_ptr<Expr>* out_expr) {
  Var memidx;
  CHECK_RESULT(ParseMemidx(loc, &memidx));
  out_expr->reset(new T(memidx, loc));
  return Result::Ok;
}